

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O1

Gia_Man_t * Gia_ManDupMux(int iVar,Gia_Man_t *pCof1,Gia_Man_t *pCof0)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  Gia_Obj_t *pGVar5;
  ulong uVar6;
  Gia_Obj_t *pGVar7;
  uint uVar8;
  int iVar9;
  Gia_Man_t *p;
  size_t sVar10;
  char *pcVar11;
  Gia_Obj_t *pGVar12;
  Vec_Int_t *pVVar13;
  Gia_Man_t *pGVar14;
  uint uVar15;
  uint uVar16;
  long lVar17;
  long lVar18;
  bool bVar19;
  Gia_Man_t *pGia [2];
  Gia_Man_t *local_48 [3];
  
  local_48[0] = pCof0;
  local_48[1] = pCof1;
  if (pCof0->nRegs != 0) {
    __assert_fail("Gia_ManRegNum(pCof0) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0x666,"Gia_Man_t *Gia_ManDupMux(int, Gia_Man_t *, Gia_Man_t *)");
  }
  if (pCof1->nRegs != 0) {
    __assert_fail("Gia_ManRegNum(pCof1) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0x667,"Gia_Man_t *Gia_ManDupMux(int, Gia_Man_t *, Gia_Man_t *)");
  }
  if (pCof0->vCos->nSize != 1) {
    __assert_fail("Gia_ManCoNum(pCof0) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0x668,"Gia_Man_t *Gia_ManDupMux(int, Gia_Man_t *, Gia_Man_t *)");
  }
  if (pCof1->vCos->nSize != 1) {
    __assert_fail("Gia_ManCoNum(pCof1) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0x669,"Gia_Man_t *Gia_ManDupMux(int, Gia_Man_t *, Gia_Man_t *)");
  }
  iVar9 = pCof1->vCis->nSize;
  if (iVar9 != pCof0->vCis->nSize) {
    __assert_fail("Gia_ManCiNum(pCof1) == Gia_ManCiNum(pCof0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0x66a,"Gia_Man_t *Gia_ManDupMux(int, Gia_Man_t *, Gia_Man_t *)");
  }
  if ((iVar < 0) || (iVar9 <= iVar)) {
    __assert_fail("iVar >= 0 && iVar < Gia_ManCiNum(pCof1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0x66b,"Gia_Man_t *Gia_ManDupMux(int, Gia_Man_t *, Gia_Man_t *)");
  }
  p = Gia_ManStart(pCof0->nObjs + pCof1->nObjs);
  pcVar4 = pCof1->pName;
  if (pcVar4 == (char *)0x0) {
    pcVar11 = (char *)0x0;
  }
  else {
    sVar10 = strlen(pcVar4);
    pcVar11 = (char *)malloc(sVar10 + 1);
    strcpy(pcVar11,pcVar4);
  }
  p->pName = pcVar11;
  pcVar4 = pCof1->pSpec;
  if (pcVar4 == (char *)0x0) {
    pcVar11 = (char *)0x0;
  }
  else {
    sVar10 = strlen(pcVar4);
    pcVar11 = (char *)malloc(sVar10 + 1);
    strcpy(pcVar11,pcVar4);
  }
  p->pSpec = pcVar11;
  Gia_ManHashAlloc(p);
  lVar17 = 0;
  do {
    pGVar14 = local_48[lVar17];
    Gia_ManFillValue(pGVar14);
    pGVar14->pObjs->Value = 0;
    pVVar13 = pGVar14->vCis;
    if (0 < pVVar13->nSize) {
      lVar18 = 0;
      do {
        iVar9 = pVVar13->pArray[lVar18];
        if (((long)iVar9 < 0) || (pGVar14->nObjs <= iVar9)) goto LAB_001e17f6;
        pGVar5 = pGVar14->pObjs;
        if (pGVar5 == (Gia_Obj_t *)0x0) break;
        if (lVar17 == 0) {
          pGVar12 = Gia_ManAppendObj(p);
          uVar6 = *(ulong *)pGVar12;
          *(ulong *)pGVar12 = uVar6 | 0x9fffffff;
          *(ulong *)pGVar12 =
               uVar6 & 0xe0000000ffffffff | 0x9fffffff |
               (ulong)(p->vCis->nSize & 0x1fffffff) << 0x20;
          pGVar7 = p->pObjs;
          if ((pGVar12 < pGVar7) || (pGVar7 + p->nObjs <= pGVar12)) {
LAB_001e1815:
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          Vec_IntPush(p->vCis,(int)((ulong)((long)pGVar12 - (long)pGVar7) >> 2) * -0x55555555);
          pGVar7 = p->pObjs;
          if ((pGVar12 < pGVar7) || (pGVar7 + p->nObjs <= pGVar12)) goto LAB_001e1815;
          uVar8 = (int)((ulong)((long)pGVar12 - (long)pGVar7) >> 2) * 0x55555556;
        }
        else {
          if (pCof0->vCis->nSize <= lVar18) goto LAB_001e1834;
          iVar1 = pCof0->vCis->pArray[lVar18];
          if (((long)iVar1 < 0) || (pCof0->nObjs <= iVar1)) goto LAB_001e17f6;
          uVar8 = pCof0->pObjs[iVar1].Value;
        }
        pGVar5[iVar9].Value = uVar8;
        lVar18 = lVar18 + 1;
        pVVar13 = pGVar14->vCis;
      } while (lVar18 < pVVar13->nSize);
    }
    pVVar13 = pGVar14->vCos;
    if (0 < pVVar13->nSize) {
      lVar18 = 0;
      do {
        iVar9 = pVVar13->pArray[lVar18];
        if (((long)iVar9 < 0) || (pGVar14->nObjs <= iVar9)) goto LAB_001e17f6;
        if (pGVar14->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar5 = pGVar14->pObjs + iVar9;
        Gia_ManDupCofactorVar_rec
                  (p,pGVar14,pGVar5 + -(ulong)((uint)*(undefined8 *)pGVar5 & 0x1fffffff));
        lVar18 = lVar18 + 1;
        pVVar13 = pGVar14->vCos;
      } while (lVar18 < pVVar13->nSize);
    }
    bVar19 = lVar17 == 0;
    lVar17 = lVar17 + 1;
  } while (bVar19);
  pVVar13 = pCof0->vCos;
  if (0 < pVVar13->nSize) {
    lVar17 = 0;
LAB_001e16bc:
    iVar9 = pVVar13->pArray[lVar17];
    if (((long)iVar9 < 0) || (pCof0->nObjs <= iVar9)) {
LAB_001e17f6:
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    pGVar5 = pCof0->pObjs;
    if (pGVar5 != (Gia_Obj_t *)0x0) {
      if (pCof0->vCis->nSize <= iVar) {
LAB_001e1834:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar1 = pCof0->vCis->pArray[(uint)iVar];
      if (((long)iVar1 < 0) || (pCof0->nObjs <= iVar1)) goto LAB_001e17f6;
      if (pCof1->vCos->nSize <= lVar17) goto LAB_001e1834;
      iVar2 = pCof1->vCos->pArray[lVar17];
      if (((long)iVar2 < 0) || (pCof1->nObjs <= iVar2)) goto LAB_001e17f6;
      uVar16 = (uint)*(undefined8 *)(pCof1->pObjs + iVar2);
      uVar8 = (pCof1->pObjs + iVar2)[-(ulong)(uVar16 & 0x1fffffff)].Value;
      if ((int)uVar8 < 0) {
LAB_001e1853:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      uVar15 = (uint)*(undefined8 *)(pGVar5 + iVar9);
      uVar3 = (pGVar5 + iVar9)[-(ulong)(uVar15 & 0x1fffffff)].Value;
      if ((int)uVar3 < 0) goto LAB_001e1853;
      iVar9 = Gia_ManHashMux(p,pGVar5[iVar1].Value,uVar16 >> 0x1d & 1 ^ uVar8,
                             uVar15 >> 0x1d & 1 ^ uVar3);
      Gia_ManAppendCo(p,iVar9);
      lVar17 = lVar17 + 1;
      pVVar13 = pCof0->vCos;
      if (lVar17 < pVVar13->nSize) goto LAB_001e16bc;
    }
  }
  pGVar14 = Gia_ManCleanup(p);
  Gia_ManStop(p);
  return pGVar14;
}

Assistant:

Gia_Man_t * Gia_ManDupMux( int iVar, Gia_Man_t * pCof1, Gia_Man_t * pCof0 )
{
    Gia_Man_t * pGia[2] = {pCof0, pCof1};
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i, n;
    assert( Gia_ManRegNum(pCof0) == 0 );
    assert( Gia_ManRegNum(pCof1) == 0 );
    assert( Gia_ManCoNum(pCof0) == 1 );
    assert( Gia_ManCoNum(pCof1) == 1 );
    assert( Gia_ManCiNum(pCof1) == Gia_ManCiNum(pCof0) );
    assert( iVar >= 0 && iVar < Gia_ManCiNum(pCof1) );
    pNew = Gia_ManStart( Gia_ManObjNum(pCof1) + Gia_ManObjNum(pCof0) );
    pNew->pName = Abc_UtilStrsav( pCof1->pName );
    pNew->pSpec = Abc_UtilStrsav( pCof1->pSpec );
    Gia_ManHashAlloc( pNew );
    for ( n = 0; n < 2; n++ )
    {
        Gia_ManFillValue( pGia[n] );
        Gia_ManConst0(pGia[n])->Value = 0;
        Gia_ManForEachCi( pGia[n], pObj, i )
            pObj->Value = n ? Gia_ManCi(pGia[0], i)->Value : Gia_ManAppendCi(pNew);
        Gia_ManForEachCo( pGia[n], pObj, i )
            Gia_ManDupCofactorVar_rec( pNew, pGia[n], Gia_ObjFanin0(pObj) );
    }
    Gia_ManForEachCo( pGia[0], pObj, i )
    {
        int Ctrl = Gia_ManCi(pGia[0], iVar)->Value;
        int Lit1 = Gia_ObjFanin0Copy(Gia_ManCo(pGia[1], i));
        int Lit0 = Gia_ObjFanin0Copy(pObj);
        Gia_ManAppendCo( pNew, Gia_ManHashMux( pNew, Ctrl, Lit1, Lit0 ) );
    }
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}